

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15949f2::UnredactedDebugFormatAPITest_MessageUnredactedShortDebugFormat_Test::
~UnredactedDebugFormatAPITest_MessageUnredactedShortDebugFormat_Test
          (UnredactedDebugFormatAPITest_MessageUnredactedShortDebugFormat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnredactedDebugFormatAPITest, MessageUnredactedShortDebugFormat) {
  proto2_unittest::RedactedFields proto;
  proto2_unittest::TestNestedMessageRedaction redacted_nested_proto;
  proto2_unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string("hello");
  unredacted_nested_proto.set_optional_unredacted_nested_string("world");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;

  EXPECT_THAT(UnredactedShortDebugFormatForTest(proto),
              StrEq("optional_redacted_message { "
                    "optional_unredacted_nested_string: \"hello\" } "
                    "optional_unredacted_message { "
                    "optional_unredacted_nested_string: \"world\" }"));
}